

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O1

int lj_cf_ffi_fill(lua_State *L)

{
  uint uVar1;
  uint uVar2;
  void *__s;
  
  __s = ffi_checkptr(L,1,0x11);
  uVar1 = ffi_checkint(L,2);
  if ((L->base + 2 < L->top) && (*(int *)((long)L->base + 0x14) != -1)) {
    uVar2 = ffi_checkint(L,3);
  }
  else {
    uVar2 = 0;
  }
  memset(__s,uVar2 & 0xff,(ulong)uVar1);
  return 0;
}

Assistant:

LJLIB_CF(ffi_fill)	LJLIB_REC(.)
{
  void *dp = ffi_checkptr(L, 1, CTID_P_VOID);
  CTSize len = (CTSize)ffi_checkint(L, 2);
  int32_t fill = 0;
  if (L->base+2 < L->top && !tvisnil(L->base+2)) fill = ffi_checkint(L, 3);
  memset(dp, fill, len);
  return 0;
}